

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

int allphone_search_step(ps_search_t *search,int frame_idx)

{
  int *piVar1;
  int32 n;
  acmod_t *acmod_00;
  bin_mdef_t *pbVar2;
  ps_search_t *ppVar3;
  hmm_t *phVar4;
  cmd_ln_t *pcVar5;
  int32 iVar6;
  int iVar7;
  int iVar8;
  _func_int_ps_search_t_ptr *p_Var9;
  undefined8 *puVar10;
  long *plVar11;
  long *plVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ps_latlink_t *list;
  long lVar16;
  acmod_t *acmod;
  ps_searchfuncs_t **pppVar17;
  int frame_idx_local;
  int32 local_58;
  int32 local_54;
  cmd_ln_t *local_50;
  ps_search_t *local_48;
  bin_mdef_t *local_40;
  ps_latlink_t *local_38;
  
  acmod_00 = search->acmod;
  frame_idx_local = frame_idx;
  if (acmod_00->compallsen == '\0') {
    pbVar2 = acmod_00->mdef;
    acmod_clear_active(acmod_00);
    for (lVar16 = 0; lVar16 < pbVar2->n_ciphone; lVar16 = lVar16 + 1) {
      pppVar17 = &(search[1].pls)->vt + lVar16;
      while (phVar4 = (hmm_t *)*pppVar17, phVar4 != (hmm_t *)0x0) {
        if (phVar4->frame == *(int *)&search[1].d2p) {
          acmod_activate_hmm(acmod_00,phVar4);
        }
        pppVar17 = (ps_searchfuncs_t **)(phVar4[1].score + 4);
      }
    }
  }
  p_Var9 = (_func_int_ps_search_t_ptr *)acmod_score(acmod_00,&frame_idx_local);
  *(int *)&search[1].dag = *(int *)&search[1].dag + acmod_00->n_senone_active;
  pbVar2 = search->acmod->mdef;
  ppVar3 = search[1].pls;
  (search[1].vt)->finish = p_Var9;
  iVar13 = -0x20000000;
  iVar15 = 0;
  while (uVar14 = (uint)(short)iVar15, (int)uVar14 < pbVar2->n_ciphone) {
    pppVar17 = &ppVar3->vt + uVar14;
    while (phVar4 = (hmm_t *)*pppVar17, phVar4 != (hmm_t *)0x0) {
      if (phVar4->frame == *(int *)&search[1].d2p) {
        piVar1 = (int *)((long)&search[1].hyp_str + 4);
        *piVar1 = *piVar1 + 1;
        iVar6 = hmm_vit_eval(phVar4);
        if (iVar13 < iVar6) {
          iVar13 = iVar6;
        }
      }
      pppVar17 = (ps_searchfuncs_t **)(phVar4[1].score + 4);
    }
    iVar15 = uVar14 + 1;
  }
  list = search[1].last_link;
  iVar6 = *(int32 *)&list->best_prev;
  iVar15 = *(int *)((long)&search[1].acmod + 4);
  local_48 = search[1].pls;
  local_40 = search->acmod->mdef;
  iVar8 = *(int *)&search[1].d2p;
  local_50 = search[1].config;
  iVar7 = 0;
  local_38 = list;
  while (uVar14 = (uint)(short)iVar7, (int)uVar14 < local_40->n_ciphone) {
    pppVar17 = &local_48->vt + uVar14;
    while (phVar4 = (hmm_t *)*pppVar17, phVar4 != (hmm_t *)0x0) {
      if (phVar4->frame == iVar8) {
        if (phVar4->bestscore < iVar15 + iVar13) {
          hmm_clear(phVar4);
        }
        else {
          puVar10 = (undefined8 *)
                    __ckd_calloc__(1,0x18,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                   ,0x197);
          *(int *)(puVar10 + 2) = iVar8;
          *puVar10 = phVar4;
          n = phVar4->out_history;
          *(int32 *)((long)puVar10 + 0x14) = n;
          *(int32 *)(puVar10 + 1) = phVar4->out_score;
          if (search[1].type == (char *)0x0) {
            *(undefined4 *)((long)puVar10 + 0xc) = *(undefined4 *)((long)&search[1].dict + 4);
          }
          else if (n < 1) {
            *(undefined4 *)((long)puVar10 + 0xc) = 0;
          }
          else {
            plVar11 = (long *)blkarray_list_get((blkarray_list_t *)list,n);
            if (*(int *)((long)plVar11 + 0x14) < 1) {
              iVar7 = ngram_bg_score((ngram_model_t *)search[1].type,
                                     (&local_50->refcount)[*(short *)(*plVar11 + 0x5c)],
                                     (&local_50->refcount)[*(short *)((long)&phVar4[1].ctx + 4)],
                                     &local_58);
            }
            else {
              plVar12 = (long *)blkarray_list_get((blkarray_list_t *)list,
                                                  *(int32 *)((long)puVar10 + 0x14));
              iVar7 = ngram_tg_score((ngram_model_t *)search[1].type,
                                     (&local_50->refcount)[*(short *)(*plVar12 + 0x5c)],
                                     (&local_50->refcount)[*(short *)(*plVar11 + 0x5c)],
                                     (&local_50->refcount)[*(short *)((long)&phVar4[1].ctx + 4)],
                                     &local_58);
            }
            *(int *)((long)puVar10 + 0xc) = iVar7 >> 10;
            list = local_38;
          }
          blkarray_list_append((blkarray_list_t *)list,puVar10);
          phVar4->frame = iVar8 + 1;
        }
      }
      pppVar17 = (ps_searchfuncs_t **)(phVar4[1].score + 4);
    }
    iVar7 = uVar14 + 1;
  }
  iVar15 = *(int *)&search[1].d2p;
  pcVar5 = search[1].config;
  for (; iVar6 < *(int *)&(search[1].last_link)->best_prev; iVar6 = iVar6 + 1) {
    plVar12 = (long *)blkarray_list_get((blkarray_list_t *)search[1].last_link,iVar6);
    lVar16 = *plVar12;
    plVar11 = (long *)(lVar16 + 0x78);
    while (puVar10 = (undefined8 *)*plVar11, puVar10 != (undefined8 *)0x0) {
      phVar4 = (hmm_t *)*puVar10;
      if ((ngram_model_t *)search[1].type == (ngram_model_t *)0x0) {
        iVar8 = *(int *)((long)&search[1].dict + 4);
      }
      else {
        if (*(int32 *)((long)plVar12 + 0x14) < 1) {
          iVar8 = ngram_bg_score((ngram_model_t *)search[1].type,
                                 (&pcVar5->refcount)[*(short *)(lVar16 + 0x5c)],
                                 (&pcVar5->refcount)[*(short *)((long)&phVar4[1].ctx + 4)],&local_54
                                );
        }
        else {
          plVar11 = (long *)blkarray_list_get((blkarray_list_t *)search[1].last_link,
                                              *(int32 *)((long)plVar12 + 0x14));
          iVar8 = ngram_tg_score((ngram_model_t *)search[1].type,
                                 (&pcVar5->refcount)[*(short *)(*plVar11 + 0x5c)],
                                 (&pcVar5->refcount)[*(short *)(lVar16 + 0x5c)],
                                 (&pcVar5->refcount)[*(short *)((long)&phVar4[1].ctx + 4)],&local_54
                                );
        }
        iVar8 = iVar8 >> 10;
      }
      iVar8 = iVar8 + (int)plVar12[1];
      if ((*(int *)&search[1].acmod + iVar13 < iVar8) && (phVar4->score[0] < iVar8)) {
        hmm_enter(phVar4,iVar8,iVar6,iVar15 + 1);
      }
      plVar11 = puVar10 + 1;
    }
  }
  *(int *)&search[1].d2p = *(int *)&search[1].d2p + 1;
  return 0;
}

Assistant:

int
allphone_search_step(ps_search_t * search, int frame_idx)
{
    int32 bestscr, frame_history_start;
    const int16 *senscr;
    allphone_search_t *allphs = (allphone_search_t *) search;
    acmod_t *acmod = search->acmod;

    if (!acmod->compallsen)
        allphone_search_sen_active(allphs);
    senscr = acmod_score(acmod, &frame_idx);
    allphs->n_sen_eval += acmod->n_senone_active;
    bestscr = phmm_eval_all(allphs, senscr);

    frame_history_start = blkarray_list_n_valid(allphs->history);
    phmm_exit(allphs, bestscr);
    phmm_trans(allphs, bestscr, frame_history_start);

    allphs->frame++;

    return 0;
}